

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O3

bool spvReadEnvironmentFromText
               (vector<char,_std::allocator<char>_> *text,spv_target_env_conflict *env)

{
  pointer pcVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  byte in_CL;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  pcVar1 = (text->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = (long)(text->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (uVar7 == 0) {
    bVar2 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if (pcVar1[uVar6] == 0x3b) {
        if (uVar7 <= uVar6 + 0xd) {
          bVar2 = 1;
          goto LAB_00622853;
        }
        lVar4 = 1;
        do {
          if ("; Version: 1."[lVar4] != pcVar1[lVar4 + uVar6]) goto LAB_00622823;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xd);
        if (uVar6 + 0xe < uVar7) {
          bVar8 = (int)pcVar1[uVar6 + 0xe] - 0x30U < 10;
        }
        else {
          bVar8 = false;
        }
        lVar4 = 0xd;
        if (((int)pcVar1[uVar6 + 0xd] - 0x30U < 7) && (!bVar8)) {
          *env = ordered_universal_envs._M_elems[(int)pcVar1[uVar6 + 0xd] - 0x30U];
          bVar2 = 1;
          in_CL = 1;
          goto LAB_00622855;
        }
LAB_00622823:
        uVar5 = uVar6 + lVar4;
        uVar6 = uVar5;
        for (; (uVar5 < uVar7 && (uVar6 = uVar5, pcVar1[uVar5] != '\n')); uVar5 = uVar5 + 1) {
          uVar6 = uVar7;
        }
      }
      else {
        iVar3 = isspace((int)pcVar1[uVar6]);
        if (iVar3 == 0) break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar7);
    bVar2 = 0;
LAB_00622853:
    in_CL = 0;
  }
LAB_00622855:
  return (bool)(bVar2 & in_CL);
}

Assistant:

bool spvReadEnvironmentFromText(const std::vector<char>& text,
                                spv_target_env* env) {
  // Version is expected to match "; Version: 1.X"
  // Version string must occur in header, that is, initial lines of comments
  // Once a non-comment line occurs, the header has ended
  for (std::size_t i = 0; i < text.size(); ++i) {
    char c = text[i];

    if (c == ';') {
      // Try to match against the expected version string
      constexpr const char* kVersionPrefix = "; Version: 1.";
      constexpr const auto kPrefixLength = 13;
      // 'minor_digit_pos' is the expected position of the version digit.
      const auto minor_digit_pos = i + kPrefixLength;
      if (minor_digit_pos >= text.size()) return false;

      // Match the prefix.
      auto j = 1;
      for (; j < kPrefixLength; ++j) {
        if (kVersionPrefix[j] != text[i + j]) break;
      }
      // j will match the prefix length if all characters before matched
      if (j == kPrefixLength) {
        // This expects only one digit in the minor number.
        static_assert(((spv::Version >> 8) & 0xff) < 10);
        char minor = text[minor_digit_pos];
        char next_char =
            minor_digit_pos + 1 < text.size() ? text[minor_digit_pos + 1] : 0;
        if (std::isdigit(minor) && !std::isdigit(next_char)) {
          const auto index = minor - '0';
          assert(index >= 0);
          if (static_cast<size_t>(index) < ordered_universal_envs.size()) {
            *env = ordered_universal_envs[index];
            return true;
          }
        }
      }

      // If no match, determine whether the header has ended (in which case,
      // assumption has failed.)
      // Skip until the next line.
      i += j;
      for (; i < text.size(); ++i) {
        if (text[i] == '\n') break;
      }
    } else if (!std::isspace(c)) {
      // Allow blanks, but end the search if we find something else.
      break;
    }
  }
  return false;
}